

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put.cpp
# Opt level: O1

matrix * __thiscall put::option_Crank_Nicolson(matrix *__return_storage_ptr__,put *this,int m,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  matrix A;
  matrix B;
  matrix C;
  double local_f8;
  double local_c8;
  matrix local_a0;
  matrix local_88;
  matrix local_70;
  matrix local_58;
  double local_40;
  ulong local_38;
  
  local_c8 = (this->super_payoff).L_;
  dVar8 = (this->super_payoff).T_;
  iVar6 = m + 1;
  matrix::matrix(&local_88,iVar6,iVar6);
  matrix::matrix(&local_70,iVar6,iVar6);
  matrix::matrix(&local_58,iVar6,iVar6);
  matrix::matrix(__return_storage_ptr__,iVar6,1);
  dVar10 = (this->super_payoff).K_;
  pdVar5 = matrix::operator()(__return_storage_ptr__,0,0);
  *pdVar5 = dVar10;
  dVar10 = (this->super_payoff).r_;
  pdVar5 = matrix::operator()(&local_88,0,0);
  dVar8 = dVar8 / (double)n;
  *pdVar5 = dVar10 * dVar8 * 0.5 + 1.0;
  dVar10 = (this->super_payoff).r_;
  pdVar5 = matrix::operator()(&local_70,0,0);
  local_40 = (double)m;
  local_c8 = local_c8 / local_40;
  dVar2 = dVar8 / local_c8;
  dVar3 = dVar8 / (local_c8 * local_c8);
  *pdVar5 = dVar10 * dVar8 * -0.5 + 1.0;
  local_38 = (ulong)(uint)n;
  if (1 < m) {
    iVar6 = 1;
    do {
      dVar10 = (this->super_payoff).r_;
      dVar9 = (this->super_payoff).sigma_;
      pdVar5 = matrix::operator()(&local_88,iVar6,iVar6 + -1);
      dVar1 = (double)iVar6 * local_c8;
      dVar9 = dVar9 * dVar1;
      *pdVar5 = dVar10 * 0.25 * dVar1 * dVar2 + dVar9 * dVar9 * -0.25 * dVar3;
      dVar10 = (this->super_payoff).r_;
      dVar9 = (this->super_payoff).sigma_;
      pdVar5 = matrix::operator()(&local_88,iVar6,iVar6);
      dVar9 = dVar9 * dVar1;
      *pdVar5 = dVar10 * dVar8 * 5.0 + dVar9 * dVar9 * dVar3 * 0.5 + 1.0;
      dVar10 = (this->super_payoff).r_;
      dVar9 = (this->super_payoff).sigma_;
      pdVar5 = matrix::operator()(&local_88,iVar6,iVar6 + 1);
      dVar9 = dVar9 * dVar1;
      *pdVar5 = dVar10 * -0.25 * dVar1 * dVar2 + dVar9 * dVar9 * -0.25 * dVar3;
      dVar10 = (this->super_payoff).r_;
      dVar9 = (this->super_payoff).sigma_;
      pdVar5 = matrix::operator()(&local_70,iVar6,iVar6 + -1);
      dVar9 = dVar9 * dVar1;
      *pdVar5 = dVar10 * -0.25 * dVar1 * dVar2 + dVar9 * dVar9 * 0.25 * dVar3;
      dVar10 = (this->super_payoff).r_;
      dVar9 = (this->super_payoff).sigma_;
      pdVar5 = matrix::operator()(&local_70,iVar6,iVar6);
      dVar9 = dVar9 * dVar1;
      *pdVar5 = dVar10 * dVar8 * -5.0 + dVar9 * dVar9 * dVar3 * -0.5 + 1.0;
      dVar10 = (this->super_payoff).r_;
      dVar9 = (this->super_payoff).sigma_;
      pdVar5 = matrix::operator()(&local_70,iVar6,iVar6 + 1);
      dVar9 = dVar9 * dVar1;
      *pdVar5 = dVar9 * dVar9 * 0.25 * dVar3 + dVar10 * dVar1 * dVar2 * 0.25;
      dVar10 = (this->super_payoff).K_;
      pdVar5 = matrix::operator()(__return_storage_ptr__,iVar6,0);
      dVar10 = dVar10 - dVar1;
      if (dVar10 <= 0.0) {
        dVar10 = 0.0;
      }
      *pdVar5 = dVar10;
      iVar6 = iVar6 + 1;
    } while (iVar6 != m);
  }
  dVar10 = (this->super_payoff).r_;
  dVar9 = (this->super_payoff).sigma_;
  pdVar5 = matrix::operator()(&local_88,m,m + -1);
  uVar4 = local_38;
  local_c8 = local_c8 * local_40;
  dVar9 = dVar9 * local_c8;
  *pdVar5 = dVar10 * 0.25 * local_c8 * dVar2 + dVar9 * dVar9 * -0.25 * dVar3;
  dVar10 = (this->super_payoff).r_;
  dVar9 = (this->super_payoff).sigma_;
  pdVar5 = matrix::operator()(&local_88,m,m);
  dVar9 = dVar9 * local_c8;
  *pdVar5 = dVar10 * dVar8 * 0.5 + dVar9 * dVar9 * dVar3 * 0.5 + 1.0;
  dVar10 = (this->super_payoff).r_;
  dVar9 = (this->super_payoff).sigma_;
  pdVar5 = matrix::operator()(&local_70,m,m + -1);
  dVar9 = dVar9 * local_c8;
  *pdVar5 = dVar10 * -0.25 * local_c8 * dVar2 + dVar9 * dVar9 * 0.25 * dVar3;
  dVar10 = (this->super_payoff).r_;
  dVar2 = (this->super_payoff).sigma_;
  pdVar5 = matrix::operator()(&local_70,m,m);
  dVar2 = dVar2 * local_c8;
  *pdVar5 = (1.0 - dVar3 * dVar2 * dVar2 * 0.5) - dVar10 * dVar8 * 0.5;
  dVar10 = (this->super_payoff).K_;
  pdVar5 = matrix::operator()(__return_storage_ptr__,m,0);
  dVar10 = dVar10 - local_c8;
  if (dVar10 <= 0.0) {
    dVar10 = 0.0;
  }
  *pdVar5 = dVar10;
  inverse(&local_a0,&local_88);
  matrix::operator=(&local_58,&local_a0);
  matrix::~matrix(&local_a0);
  mul(&local_a0,&local_58,&local_70);
  matrix::operator=(&local_58,&local_a0);
  matrix::~matrix(&local_a0);
  if (0 < (int)uVar4) {
    local_c8 = -local_c8;
    iVar6 = 1;
    do {
      mul(&local_a0,&local_58,__return_storage_ptr__);
      matrix::operator=(__return_storage_ptr__,&local_a0);
      matrix::~matrix(&local_a0);
      pdVar5 = matrix::operator()(__return_storage_ptr__,m,0);
      *pdVar5 = 0.0;
      dVar10 = (this->super_payoff).K_;
      dVar2 = exp(((this->super_payoff).T_ - (double)iVar6 * dVar8) * -(this->super_payoff).r_);
      local_f8 = 0.0;
      if (0.0 < dVar2 * dVar10 + local_c8) {
        dVar10 = (this->super_payoff).K_;
        dVar2 = exp((-(double)iVar6 * dVar8 + (this->super_payoff).T_) * -(this->super_payoff).r_);
        local_f8 = dVar2 * dVar10 + local_c8;
      }
      pdVar5 = matrix::operator()(__return_storage_ptr__,0,0);
      *pdVar5 = local_f8;
      bVar7 = iVar6 != (int)uVar4;
      iVar6 = iVar6 + 1;
    } while (bVar7);
  }
  matrix::~matrix(&local_58);
  matrix::~matrix(&local_70);
  matrix::~matrix(&local_88);
  return __return_storage_ptr__;
}

Assistant:

matrix put::option_Crank_Nicolson(int m, int n){
    double s;
    double h  = L_/m;
    double dt = T_/n;
    double lambda, nu;
    int i, k;
    lambda = dt/h;
    nu = dt/(h*h);

    matrix A(m + 1, m + 1);
    matrix B(m + 1, m + 1);
    matrix C(m + 1, m + 1);
    matrix P(m + 1, 1);

    P(0, 0) = K_;//price
    A(0, 0) = 1 + r_*dt/2;
    B(0, 0) = 1 - r_*dt/2;
    for(i = 1; i < m; i++){
        s = i * h;
        A(i, i-1) = 0.25*r_*s*lambda - 0.25*pow(sigma_*s, 2)*nu;
        A(i, i) = 1+pow(sigma_*s, 2)*nu*0.5 + r_*dt*05;
        A(i, i+1) = 0.25*-r_*s*lambda - 0.25*pow(sigma_*s, 2)*nu;
        B(i, i-1) = 0.25*-r_*s*lambda + 0.25*pow(sigma_*s, 2)*nu;
        B(i, i) = 1-pow(sigma_*s, 2)*nu*0.5 - r_*dt*05;
        B(i, i+1) = r_*s*lambda/4 + 0.25*pow(sigma_*s, 2)*nu;
        P(i, 0) = ((K_-s > 0) ? (K_-s) : 0);
    }


    s = m*h;
    A(m, m-1) = 0.25*r_*s*lambda-0.25*pow(sigma_*s, 2)*nu;
    A(m, m) = 1+pow(sigma_*s, 2)*nu*0.5+r_*dt*0.5;
    B(m, m-1) = 0.25*-r_*s*lambda+0.25*pow(sigma_*s, 2)*nu;
    B(m, m) = 1-pow(sigma_*s, 2)*nu*0.5-r_*dt*0.5;
    P(m, 0) = ((K_-s > 0) ? (K_-s) : 0);

    C = inverse(A);//operator=
    C = mul(C, B);

    for(k = 1; k <= n; k++){
        P = mul(C, P);
        P(m, 0) = 0;
        P(0, 0) = ((K_*exp(-r_*(T_-k*dt))-s > 0) ? (K_*exp(-r_*(T_-k*dt))-s) : 0);
    }
    return P;
}